

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::StartAt(LocationRecorder *this,Token *token)

{
  RepeatedField<int> *pRVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  
  iVar2 = token->line;
  pRVar1 = &(this->location_->field_0)._impl_.span_;
  iVar3 = internal::SooRep::size
                    (&pRVar1->soo_rep_,(*(byte *)((long)&this->location_->field_0 + 0x20) & 4) == 0)
  ;
  if (iVar3 < 1) {
    StartAt();
  }
  else {
    piVar4 = RepeatedField<int>::elements
                       (pRVar1,(undefined1  [16])
                               ((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4
                               ) == (undefined1  [16])0x0);
    *piVar4 = iVar2;
    iVar2 = token->column;
    pRVar1 = &(this->location_->field_0)._impl_.span_;
    iVar3 = internal::SooRep::size
                      (&pRVar1->soo_rep_,
                       (*(byte *)((long)&this->location_->field_0 + 0x20) & 4) == 0);
    if (1 < iVar3) {
      piVar4 = RepeatedField<int>::elements
                         (pRVar1,(undefined1  [16])
                                 ((undefined1  [16])(pRVar1->soo_rep_).field_0 &
                                 (undefined1  [16])0x4) == (undefined1  [16])0x0);
      piVar4[1] = iVar2;
      return;
    }
  }
  StartAt();
}

Assistant:

void Parser::LocationRecorder::StartAt(const io::Tokenizer::Token& token) {
  location_->set_span(0, token.line);
  location_->set_span(1, token.column);
}